

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Segment::~Segment(Segment *this)

{
  void *pvVar1;
  long in_RDI;
  Frame *frame;
  int32_t i_1;
  Cluster *cluster;
  int32_t i;
  MkvWriter *in_stack_ffffffffffffff90;
  Frame *in_stack_ffffffffffffffa0;
  SegmentInfo *this_00;
  Cues *in_stack_ffffffffffffffb0;
  Cluster *in_stack_ffffffffffffffc0;
  int local_1c;
  int local_c;
  
  if (*(long *)(in_RDI + 0x108) != 0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x114); local_c = local_c + 1) {
      pvVar1 = *(void **)(*(long *)(in_RDI + 0x108) + (long)local_c * 8);
      if (pvVar1 != (void *)0x0) {
        Cluster::~Cluster(in_stack_ffffffffffffffc0);
        operator_delete(pvVar1);
      }
    }
    if (*(void **)(in_RDI + 0x108) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x108));
    }
  }
  if (*(long *)(in_RDI + 0x130) != 0) {
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x13c); local_1c = local_1c + 1) {
      pvVar1 = *(void **)(*(long *)(in_RDI + 0x130) + (long)local_1c * 8);
      if (pvVar1 != (void *)0x0) {
        Frame::~Frame(in_stack_ffffffffffffffa0);
        operator_delete(pvVar1);
      }
    }
    in_stack_ffffffffffffffb0 = *(Cues **)(in_RDI + 0x130);
    if (in_stack_ffffffffffffffb0 != (Cues *)0x0) {
      operator_delete__(in_stack_ffffffffffffffb0);
    }
  }
  if (*(void **)(in_RDI + 0xd0) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0xd0));
  }
  this_00 = *(SegmentInfo **)(in_RDI + 0xf8);
  if (this_00 != (SegmentInfo *)0x0) {
    operator_delete__(this_00);
  }
  if (*(long *)(in_RDI + 0xd8) != 0) {
    MkvWriter::Close(in_stack_ffffffffffffff90);
    if (*(long **)(in_RDI + 0xd8) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0xd8) + 0x30))();
    }
  }
  if (*(long *)(in_RDI + 0xe0) != 0) {
    MkvWriter::Close(in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff90 = *(MkvWriter **)(in_RDI + 0xe0);
    if (in_stack_ffffffffffffff90 != (MkvWriter *)0x0) {
      (*(in_stack_ffffffffffffff90->super_IMkvWriter)._vptr_IMkvWriter[6])();
    }
  }
  if (*(long *)(in_RDI + 0xe8) != 0) {
    MkvWriter::Close(in_stack_ffffffffffffff90);
    if (*(long **)(in_RDI + 0xe8) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0xe8) + 0x30))();
    }
  }
  Tags::~Tags((Tags *)in_stack_ffffffffffffffb0);
  Chapters::~Chapters((Chapters *)in_stack_ffffffffffffffb0);
  Tracks::~Tracks((Tracks *)in_stack_ffffffffffffffb0);
  SegmentInfo::~SegmentInfo(this_00);
  SeekHead::~SeekHead((SeekHead *)(in_RDI + 0x20));
  Cues::~Cues(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

Segment::~Segment() {
  if (cluster_list_) {
    for (int32_t i = 0; i < cluster_list_size_; ++i) {
      Cluster* const cluster = cluster_list_[i];
      delete cluster;
    }
    delete[] cluster_list_;
  }

  if (frames_) {
    for (int32_t i = 0; i < frames_size_; ++i) {
      Frame* const frame = frames_[i];
      delete frame;
    }
    delete[] frames_;
  }

  delete[] chunk_name_;
  delete[] chunking_base_name_;

  if (chunk_writer_cluster_) {
    chunk_writer_cluster_->Close();
    delete chunk_writer_cluster_;
  }
  if (chunk_writer_cues_) {
    chunk_writer_cues_->Close();
    delete chunk_writer_cues_;
  }
  if (chunk_writer_header_) {
    chunk_writer_header_->Close();
    delete chunk_writer_header_;
  }
}